

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qutil.cc
# Opt level: O0

void set_locale(void)

{
  runtime_error *e;
  runtime_error *anon_var_0;
  locale local_18 [8];
  locale local_10 [8];
  
  std::locale::locale(local_18,"en_US.UTF-8");
  std::locale::global(local_10);
  std::locale::~locale(local_10);
  std::locale::~locale(local_18);
  return;
}

Assistant:

static void
set_locale()
{
    try {
        // First try a locale known to put commas in numbers.
        std::locale::global(std::locale("en_US.UTF-8"));
    } catch (std::runtime_error&) {
        try {
            // If that fails, fall back to the user's default locale.
            std::locale::global(std::locale(""));
        } catch (std::runtime_error& e) {
            // Ignore this error on Windows without MSVC. We get
            // enough test coverage on other platforms, and mingw
            // seems to have limited locale support (as of
            // 2020-10).
#if !defined(_WIN32) || defined(_MSC_VER)
            throw e;
#endif
        }
    }
}